

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void run(string *rootDir,string *containerId,string *distroName,string *command,
        ResourceLimits *resourceLimits,bool buildImage)

{
  bool bVar1;
  ostream *poVar2;
  Container *container;
  
  bVar1 = imageExists(rootDir,containerId);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Running image ");
    poVar2 = std::operator<<(poVar2,(string *)containerId);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  container = createContainer(distroName,containerId,rootDir,command,resourceLimits,buildImage,bVar1
                             );
  bVar1 = setUpContainer(container);
  if (bVar1) {
    startContainer(container);
  }
  cleanUpContainer(container);
  return;
}

Assistant:

void run(std::string rootDir,
         std::string containerId,
         std::string distroName,
         std::string command,
         ResourceLimits* resourceLimits,
         bool buildImage)
{
    bool isImage = imageExists(rootDir, containerId);

    if (isImage)
        std::cout << "Running image " << containerId << std::endl;

    Container* container = createContainer(distroName, containerId, rootDir,
                                           command, resourceLimits, buildImage, isImage);
    if (setUpContainer(container))
    {
        startContainer(container);
    }
    cleanUpContainer(container);
}